

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 LexExtractNowdoc(SyStream *pStream,SyToken *pToken)

{
  byte bVar1;
  sxi32 sVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pB2;
  ulong uVar11;
  uint nSize;
  byte *pbVar12;
  byte *pB1;
  byte *pbVar13;
  long lVar14;
  int iVar15;
  sxu32 local_5c;
  
  pB1 = pStream->zText;
  pbVar7 = pStream->zEnd;
  if (pbVar7 <= pB1) {
    return -0x19;
  }
  while( true ) {
    pbVar12 = pB1 + 1;
    bVar1 = *pB1;
    uVar6 = (ulong)bVar1;
    if (((0xbf < uVar6) || (ppuVar3 = __ctype_b_loc(), bVar1 == 10)) ||
       (((*ppuVar3)[uVar6] & 0x2000) == 0)) break;
    pB1 = pbVar12;
    if (pbVar12 == pbVar7) {
      return -0x19;
    }
  }
  if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
    uVar6 = (ulong)*pbVar12;
    pB1 = pbVar12;
  }
  pbVar12 = pB1;
  if ((((byte)uVar6 < 0xc0) && (ppuVar3 = __ctype_b_loc(), (byte)uVar6 != 0x5f)) &&
     (((*ppuVar3)[uVar6] & 8) == 0)) {
    return -0x19;
  }
  do {
    pbVar4 = pbVar12;
    if (pbVar7 <= pbVar4) break;
    lVar14 = 0;
    pbVar9 = pbVar4;
    do {
      pbVar9 = pbVar9 + 1;
      uVar6 = (ulong)pbVar4[lVar14];
      pbVar12 = pbVar9;
      if (0xbf < uVar6) break;
      ppuVar3 = __ctype_b_loc();
      if ((uVar6 != 0x5f) && (((*ppuVar3)[uVar6] & 8) == 0)) {
        pbVar12 = pbVar4 + lVar14;
        break;
      }
      lVar14 = lVar14 + 1;
      pbVar12 = pbVar7;
    } while ((long)pbVar7 - (long)pbVar4 != lVar14);
  } while (pbVar12 != pbVar4);
  if ((*pbVar4 == 0x27) || (pbVar12 = pbVar4, *pbVar4 == 0x22)) {
    pbVar12 = pbVar4 + 1;
  }
  if (pbVar12 < pbVar7) {
    lVar14 = (long)pbVar7 - (long)pbVar12;
    iVar15 = (int)pbVar12;
    do {
      iVar15 = iVar15 + 1;
      pbVar9 = pbVar12 + 1;
      bVar1 = *pbVar12;
      uVar6 = (ulong)bVar1;
      if (((0xbf < uVar6) || (ppuVar3 = __ctype_b_loc(), uVar6 == 10)) ||
         (((*ppuVar3)[uVar6] & 0x2000) == 0)) {
        nSize = (uint)((long)pbVar4 - (long)pB1);
        if (nSize == 0) {
          return -0x19;
        }
        if (bVar1 != 10) {
          return -0x19;
        }
        local_5c = pStream->nLine + 1;
        pStream->nLine = local_5c;
        pB2 = pbVar9;
        if (pbVar7 <= pbVar9) goto LAB_00124d96;
        uVar6 = (long)pbVar4 - (long)pB1 & 0xffffffff;
        pbVar4 = pbVar9;
        goto LAB_00124c4a;
      }
      lVar14 = lVar14 + -1;
      pbVar12 = pbVar9;
    } while (lVar14 != 0);
  }
  return -0x19;
LAB_00124c4a:
  pbVar13 = pbVar4 + uVar6 + 2;
  pbVar10 = pbVar4;
  while (*pbVar10 != 10) {
    pB2 = pbVar10 + 1;
    pbVar4 = pbVar4 + 1;
    pbVar13 = pbVar13 + 1;
    pbVar10 = pB2;
    if (pbVar7 <= pB2) goto LAB_00124d96;
  }
  local_5c = local_5c + 1;
  pStream->nLine = local_5c;
  pB2 = pbVar10 + 1;
  if ((nSize <= (uint)(((int)pbVar7 + -1) - (int)pbVar4)) &&
     (sVar2 = SyMemcmp(pB1,pB2,nSize), sVar2 == 0)) {
    pbVar5 = pbVar10 + uVar6 + 1;
    if (pbVar5 < pbVar7) {
      while( true ) {
        bVar1 = *pbVar5;
        uVar11 = (ulong)bVar1;
        if (((0xbf < uVar11) || (ppuVar3 = __ctype_b_loc(), uVar11 == 10)) ||
           (((*ppuVar3)[uVar11] & 0x2000) == 0)) break;
        pbVar5 = pbVar5 + 1;
        pbVar13 = pbVar13 + 1;
        if (pbVar7 <= pbVar5) goto LAB_00124df6;
      }
      pB2 = pbVar5;
      if (uVar11 == 0x3b) {
        do {
          pB2 = pbVar13;
          if (pbVar7 <= pB2) goto LAB_00124d73;
          bVar1 = *pB2;
          uVar11 = (ulong)bVar1;
          if (0xbf < uVar11) goto LAB_00124cbd;
          ppuVar3 = __ctype_b_loc();
        } while ((uVar11 != 10) && (pbVar13 = pB2 + 1, ((*ppuVar3)[uVar11] & 0x2000) != 0));
      }
      if (bVar1 != 10) goto LAB_00124cbd;
LAB_00124d73:
      pStream->zText = pbVar5;
    }
    else {
      pbVar7 = pbVar10 + uVar6 + 1;
LAB_00124df6:
      pStream->zText = pbVar7;
    }
    iVar8 = (int)pbVar4 + 1;
    goto LAB_00124d9f;
  }
LAB_00124cbd:
  pbVar4 = pB2;
  if (pbVar7 <= pB2) {
LAB_00124d96:
    iVar8 = (int)pB2;
    pStream->zText = pbVar7;
LAB_00124d9f:
    pToken->nType = 0x10000;
    (pToken->sData).zString = (char *)pbVar9;
    uVar6 = (ulong)(uint)(iVar8 - iVar15);
    while( true ) {
      (pToken->sData).nByte = (uint)uVar6;
      if (uVar6 == 0) {
        return 0;
      }
      bVar1 = pbVar12[uVar6];
      if (0xffffffffffffffbf < (ulong)(long)(char)bVar1) break;
      ppuVar3 = __ctype_b_loc();
      uVar6 = uVar6 - 1;
      if ((*(byte *)((long)*ppuVar3 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0) {
        return 0;
      }
    }
    return 0;
  }
  goto LAB_00124c4a;
}

Assistant:

static sxi32 LexExtractNowdoc(SyStream *pStream, SyToken *pToken)
{
	const unsigned char *zIn  = pStream->zText;
	const unsigned char *zEnd = pStream->zEnd;
	const unsigned char *zPtr;
	SyString sDelim;
	SyString sStr;
	/* Jump leading white spaces */
	while( zIn < zEnd && zIn[0] < 0xc0 && SyisSpace(zIn[0]) && zIn[0] != '\n' ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* A simple symbol, return immediately */
		return SXERR_CONTINUE;
	}
	if( zIn[0] == '\'' || zIn[0] == '"' ){
		zIn++;
	}
	if( zIn[0] < 0xc0 && !SyisAlphaNum(zIn[0]) && zIn[0] != '_' ){
		/* Invalid delimiter, return immediately */
		return SXERR_CONTINUE;
	}
	/* Isolate the identifier */
	sDelim.zString = (const char *)zIn;
	for(;;){
		zPtr = zIn;
		/* Skip alphanumeric stream */
		while( zPtr < zEnd && zPtr[0] < 0xc0 && (SyisAlphaNum(zPtr[0]) || zPtr[0] == '_') ){
			zPtr++;
		}
		if( zPtr < zEnd && zPtr[0] >= 0xc0 ){
			zPtr++;
			/* UTF-8 stream */
			while( zPtr < zEnd && ((zPtr[0] & 0xc0) == 0x80) ){
				zPtr++;
			}
		}
		if( zPtr == zIn ){
			/* Not an UTF-8 or alphanumeric stream */
			break;
		}
		/* Synchronize pointers */
		zIn = zPtr;
	}
	/* Get the identifier length */
	sDelim.nByte = (sxu32)((const char *)zIn-sDelim.zString);
	if( zIn[0] == '"' || zIn[0] == '\'' ){
		/* Jump the trailing single quote */
		zIn++;
	}
	/* Jump trailing white spaces */
	while( zIn < zEnd && zIn[0] < 0xc0 && SyisSpace(zIn[0]) && zIn[0] != '\n' ){
		zIn++;
	}
	if( sDelim.nByte <= 0 || zIn >= zEnd || zIn[0] != '\n' ){
		/* Invalid syntax */
		return SXERR_CONTINUE;
	}
	pStream->nLine++; /* Increment line counter */
	zIn++;
	/* Isolate the delimited string */
	sStr.zString = (const char *)zIn;
	/* Go and found the closing delimiter */
	for(;;){
		/* Synchronize with the next line */
		while( zIn < zEnd && zIn[0] != '\n' ){
			zIn++;
		}
		if( zIn >= zEnd ){
			/* End of the input reached, break immediately */
			pStream->zText = pStream->zEnd;
			break;
		}
		pStream->nLine++; /* Increment line counter */
		zIn++;
		if( (sxu32)(zEnd - zIn) >= sDelim.nByte && SyMemcmp((const void *)sDelim.zString, (const void *)zIn, sDelim.nByte) == 0 ){
			zPtr = &zIn[sDelim.nByte];
			while( zPtr < zEnd && zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) && zPtr[0] != '\n' ){
				zPtr++;
			}
			if( zPtr >= zEnd ){
				/* End of input */
				pStream->zText = zPtr;
				break;
			}
			if( zPtr[0] == ';' ){
				const unsigned char *zCur = zPtr;
				zPtr++;
				while( zPtr < zEnd && zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) && zPtr[0] != '\n' ){
					zPtr++;
				}
				if( zPtr >= zEnd || zPtr[0] == '\n' ){
					/* Closing delimiter found, break immediately */
					pStream->zText = zCur; /* Keep the semi-colon */
					break;
				}
			}else if( zPtr[0] == '\n' ){
				/* Closing delimiter found, break immediately */
				pStream->zText = zPtr; /* Synchronize with the stream cursor */
				break;
			}
			/* Synchronize pointers and continue searching */
			zIn = zPtr;
		}
	} /* For(;;) */
	/* Get the delimited string length */
	sStr.nByte = (sxu32)((const char *)zIn-sStr.zString);
	/* Record token type and length */
	pToken->nType = JX9_TK_NOWDOC;
	SyStringDupPtr(&pToken->sData, &sStr);
	/* Remove trailing white spaces */
	SyStringRightTrim(&pToken->sData);
	/* All done */
	return SXRET_OK;
}